

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

ray * __thiscall camera::get_ray(ray *__return_storage_ptr__,camera *this,double s,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = this->lens_radius;
  do {
    iVar16 = rand();
    dVar18 = (double)iVar16 * 4.656612873077393e-10 + (double)iVar16 * 4.656612873077393e-10 + -1.0;
    iVar16 = rand();
    dVar7 = (double)iVar16 * 4.656612873077393e-10 + (double)iVar16 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar18 * dVar18 + dVar7 * dVar7);
  dVar18 = dVar18 * dVar1;
  dVar7 = dVar7 * dVar1;
  dVar17 = (this->v).e[2] * dVar7 + (this->u).e[2] * dVar18;
  dVar1 = (this->horizontal).e[2];
  dVar2 = (this->lower_left_corner).e[2];
  dVar3 = (this->origin).e[2];
  dVar4 = (this->vertical).e[2];
  dVar5 = this->time0;
  dVar6 = this->time1;
  dVar8 = dVar7 * (this->v).e[0] + dVar18 * (this->u).e[0];
  dVar7 = dVar7 * (this->v).e[1] + dVar18 * (this->u).e[1];
  dVar18 = (this->origin).e[0];
  dVar9 = (this->origin).e[1];
  dVar10 = (this->horizontal).e[0];
  dVar11 = (this->horizontal).e[1];
  dVar12 = (this->lower_left_corner).e[0];
  dVar13 = (this->lower_left_corner).e[1];
  dVar14 = (this->vertical).e[0];
  dVar15 = (this->vertical).e[1];
  iVar16 = rand();
  (__return_storage_ptr__->orig).e[0] = dVar8 + dVar18;
  (__return_storage_ptr__->orig).e[1] = dVar7 + dVar9;
  (__return_storage_ptr__->orig).e[2] = dVar17 + dVar3;
  (__return_storage_ptr__->dir).e[0] = ((t * dVar14 + dVar12 + s * dVar10) - dVar18) - dVar8;
  (__return_storage_ptr__->dir).e[1] = ((t * dVar15 + dVar13 + s * dVar11) - dVar9) - dVar7;
  (__return_storage_ptr__->dir).e[2] = ((dVar4 * t + dVar1 * s + dVar2) - dVar3) - dVar17;
  __return_storage_ptr__->tm = (double)iVar16 * 4.656612873077393e-10 * (dVar6 - dVar5) + dVar5;
  return __return_storage_ptr__;
}

Assistant:

ray get_ray(double s, double t) {
        vec3 rd = lens_radius * random_in_unit_disk();
        vec3 offset = u * rd.x() + v * rd.y();

        return ray(
                origin + offset,
                lower_left_corner + s * horizontal + t * vertical - origin - offset,
                random_double(time0, time1)
                );
    }